

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::CanonicalizationState::updateUses
          (CanonicalizationState *this,ReplacementMap *replacements,
          unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
          *info)

{
  uintptr_t uVar1;
  int *piVar2;
  Kind KVar3;
  anon_union_8_2_a60233d5_for_Task_2 __x;
  ReplacementMap *pRVar4;
  TypeInfo *pTVar5;
  HeapTypeInfo *pHVar6;
  iterator iVar7;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __tmp;
  anon_union_8_2_a60233d5_for_Task_2 aVar8;
  __ireturn_type _Var9;
  value_type local_c0;
  HeapType root;
  HeapType super;
  __node_base_ptr *local_a0;
  size_type local_98;
  __node_base local_90;
  size_type sStack_88;
  float local_80;
  size_t local_78;
  __node_base_ptr p_Stack_70;
  char local_68;
  CanonicalizationState *local_60;
  ReplacementMap *local_50;
  CanonicalizationState *local_48;
  value_type local_40;
  
  if ((this->newInfos).
      super__Vector_base<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>,_std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_c0.id = (uintptr_t)(replacements->_M_h)._M_buckets;
    local_40.field_1.type = (Type *)&local_c0;
    local_a0 = &p_Stack_70;
    root.id = 0;
    super.id = 0;
    local_98 = 1;
    local_90._M_nxt = (_Hash_node_base *)0x0;
    sStack_88 = 0;
    local_80 = 1.0;
    local_78 = 0;
    p_Stack_70 = (__node_base_ptr)0x0;
    local_68 = '\x01';
    local_40.kind = ScanHeapType;
    local_60 = this;
    local_50 = replacements;
    local_48 = this;
    std::
    vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
    ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                 *)&root,&local_40);
    while (root.id != super.id) {
      uVar1 = super.id - 0x10;
      piVar2 = (int *)(super.id - 0x10);
      __x = (anon_union_8_2_a60233d5_for_Task_2)
            ((anon_union_8_2_a60233d5_for_Task_2 *)(super.id - 8))->type;
      super.id = uVar1;
      if (*piVar2 == 3) {
        local_40.kind = PostHeapType;
        local_40.field_1 = __x;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
        ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                     *)&root,&local_40);
        if (local_68 == '\x01') {
          _Var9 = std::__detail::
                  _Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::insert((_Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)&local_a0,(value_type *)__x.type);
          if ((((undefined1  [16])_Var9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (0xd < (__x.heapType)->id)) {
            pHVar6 = getHeapTypeInfo((HeapType)(__x.heapType)->id);
            KVar3 = pHVar6->kind;
            if (KVar3 == ArrayKind) {
              local_40.field_1.type = (Type *)&pHVar6->field_6;
              local_40.kind = ScanType;
              std::
              vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
              ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                           *)&root,&local_40);
            }
            else if (KVar3 == StructKind) {
              aVar8 = (anon_union_8_2_a60233d5_for_Task_2)
                      (pHVar6->field_6).struct_.fields.
                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_finish;
              while ((pointer)aVar8.type !=
                     (pHVar6->field_6).struct_.fields.
                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_start) {
                aVar8.type = aVar8.type + -2;
                local_40.kind = ScanType;
                local_40.field_1.type = aVar8.type;
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                             *)&root,&local_40);
              }
            }
            else if (KVar3 == SignatureKind) {
              local_40.field_1.type = (Type *)((long)&pHVar6->field_6 + 8);
              local_40.kind = ScanType;
              std::
              vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
              ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                           *)&root,&local_40);
              local_40.field_1.type = (Type *)&pHVar6->field_6;
              local_40.kind = ScanType;
              std::
              vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
              ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                           *)&root,&local_40);
            }
          }
        }
        else {
          iVar7 = std::
                  unordered_map<wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>_>
                  ::find((unordered_map<wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>_>
                          *)local_60,(key_type *)__x.type);
          if (iVar7.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
              ._M_cur != (__node_type *)0x0) {
            (__x.type)->id =
                 *(uintptr_t *)
                  ((long)iVar7.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
                         ._M_cur + 0x10);
          }
        }
        local_40.kind = PreHeapType;
        local_40.field_1 = __x;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
        ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                     *)&root,&local_40);
      }
      else if (*piVar2 == 2) {
        local_40.kind = PostType;
        local_40.field_1 = __x;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
        ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                     *)&root,&local_40);
        local_68 = '\0';
        if (6 < (__x.type)->id) {
          pTVar5 = getTypeInfo((Type)(__x.type)->id);
          if (pTVar5->kind == RefKind) {
            local_40.field_1.type = (Type *)&pTVar5->field_2;
            local_40.kind = ScanHeapType;
            std::
            vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
            ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                         *)&root,&local_40);
          }
          else if (pTVar5->kind == TupleKind) {
            aVar8 = (anon_union_8_2_a60233d5_for_Task_2)
                    (pTVar5->field_2).tuple.types.
                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_finish;
            while (aVar8.type !=
                   (pTVar5->field_2).tuple.types.
                   super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start) {
              aVar8.type = aVar8.type + -1;
              local_40.kind = ScanType;
              local_40.field_1.type = aVar8.type;
              std::
              vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
              ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                           *)&root,&local_40);
            }
          }
        }
        local_40.kind = PreType;
        local_40.field_1 = __x;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
        ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                     *)&root,&local_40);
      }
    }
    HeapTypeGraphWalker<ChildUpdater>::~HeapTypeGraphWalker
              ((HeapTypeGraphWalker<ChildUpdater> *)&root);
    pRVar4 = local_50;
    root.id = (uintptr_t)(local_50->_M_h)._M_buckets[1];
    if ((__node_base_ptr)root.id != (__node_base_ptr)0x0) {
      iVar7 = std::
              unordered_map<wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>_>
              ::find((unordered_map<wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>_>
                      *)local_48,&root);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
          ._M_cur != (__node_type *)0x0) {
        pHVar6 = getHeapTypeInfo((HeapType)
                                 *(uintptr_t *)
                                  ((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
                                         ._M_cur + 0x10));
        (pRVar4->_M_h)._M_buckets[1] = (__node_base_ptr)pHVar6;
      }
    }
  }
  return;
}

Assistant:

void CanonicalizationState::updateUses(ReplacementMap& replacements,
                                       std::unique_ptr<HeapTypeInfo>& info) {
  if (replacements.empty()) {
    return;
  }
  // Replace all old types reachable from `info`.
  struct ChildUpdater : HeapTypeChildWalker<ChildUpdater> {
    ReplacementMap& replacements;
    ChildUpdater(ReplacementMap& replacements) : replacements(replacements) {}
    void noteChild(HeapType* child) {
      if (auto it = replacements.find(*child); it != replacements.end()) {
        *child = it->second.getAsHeapType();
      }
    }
  };
  HeapType root = asHeapType(info);
  ChildUpdater(replacements).walkRoot(&root);

  // We may need to update its supertype as well.
  if (info->supertype) {
    HeapType super(uintptr_t(info->supertype));
    if (auto it = replacements.find(super); it != replacements.end()) {
      info->supertype = getHeapTypeInfo(it->second.getAsHeapType());
    }
  }
}